

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

BOOL __thiscall
Js::HeapArgumentsObject::IsFormalArgument
          (HeapArgumentsObject *this,PropertyId propertyId,uint32 *pIndex)

{
  BOOL BVar1;
  ScriptContext *this_00;
  undefined1 local_21;
  uint32 *pIndex_local;
  PropertyId propertyId_local;
  HeapArgumentsObject *this_local;
  
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar1 = ScriptContext::IsNumericPropertyId(this_00,propertyId,pIndex);
  local_21 = false;
  if (BVar1 != 0) {
    BVar1 = IsFormalArgument(this,*pIndex);
    local_21 = BVar1 != 0;
  }
  return (BOOL)local_21;
}

Assistant:

BOOL HeapArgumentsObject::IsFormalArgument(PropertyId propertyId, uint32* pIndex)
    {
        return
            this->GetScriptContext()->IsNumericPropertyId(propertyId, pIndex) &&
            IsFormalArgument(*pIndex);
    }